

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool Catch::list(IStreamingReporter *reporter,Config *config)

{
  pointer pTVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *pvVar3;
  undefined4 extraout_var_00;
  iterator iVar4;
  _Base_ptr p_Var5;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar6;
  undefined4 extraout_var_01;
  long lVar7;
  IReporterFactory *pIVar8;
  _Rb_tree_node_base *p_Var9;
  char cVar10;
  key_type *__k;
  pointer pTVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_bool> pVar12;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> descriptions;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> matchedTestCases;
  map<Catch::StringRef,_Catch::TagInfo,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  tagCounts;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> matchedTestCases_1;
  undefined1 local_118 [8];
  _Rb_tree_node_base _Stack_110;
  size_t local_f0;
  size_t sStack_e8;
  IStreamingReporter *local_d8;
  pointer local_d0;
  undefined1 local_c8 [16];
  TagInfo local_b8;
  _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  local_78;
  _Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_48;
  
  cVar10 = (config->m_data).listTests;
  if ((bool)cVar10 == true) {
    iVar2 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pvVar3 = getAllTestCasesSorted(&config->super_IConfig);
    filterTests((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)local_c8,
                pvVar3,(TestSpec *)CONCAT44(extraout_var,iVar2),&config->super_IConfig);
    (*reporter->_vptr_IStreamingReporter[0x15])
              (reporter,(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                        local_c8,config);
    std::_Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::~_Vector_base
              ((_Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
               local_c8);
  }
  if ((config->m_data).listTags == true) {
    local_d8 = reporter;
    iVar2 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pvVar3 = getAllTestCasesSorted(&config->super_IConfig);
    filterTests((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)&local_48,
                pvVar3,(TestSpec *)CONCAT44(extraout_var_00,iVar2),&config->super_IConfig);
    local_78._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78._M_impl.super__Rb_tree_header._M_header;
    local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d0 = local_48._M_impl.super__Vector_impl_data._M_finish;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pTVar11 = local_48._M_impl.super__Vector_impl_data._M_start; pTVar11 != local_d0;
        pTVar11 = pTVar11 + 1) {
      pTVar1 = (pTVar11->m_info->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (__k = &((pTVar11->m_info->tags).
                   super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                   super__Vector_impl_data._M_start)->lowerCased; (pointer)(__k + -1) != pTVar1;
          __k = __k + 2) {
        iVar4 = std::
                _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
                ::find(&local_78,__k);
        if ((_Rb_tree_header *)iVar4._M_node == &local_78._M_impl.super__Rb_tree_header) {
          local_118 = (undefined1  [8])0x0;
          _Stack_110._0_8_ = (pointer)0x0;
          _Stack_110._M_parent = (_Base_ptr)0x0;
          _Stack_110._M_left = &_Stack_110;
          local_f0 = 0;
          sStack_e8 = 0;
          local_c8._0_8_ = __k->m_start;
          local_c8._8_8_ = __k->m_size;
          _Stack_110._M_right = _Stack_110._M_left;
          TagInfo::TagInfo(&local_b8,(TagInfo *)local_118);
          pVar12 = std::
                   _Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,std::less<Catch::StringRef>,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                   ::_M_emplace_unique<std::pair<Catch::StringRef,Catch::TagInfo>>
                             ((_Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,std::less<Catch::StringRef>,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                               *)&local_78,(pair<Catch::StringRef,_Catch::TagInfo> *)local_c8);
          iVar4._M_node = (_Base_ptr)pVar12.first._M_node;
          std::
          _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
          ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                       *)&local_b8);
          std::
          _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
          ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                       *)local_118);
        }
        TagInfo::add((TagInfo *)&iVar4._M_node[1]._M_left,__k[-1]);
      }
    }
    local_c8._0_8_ = (pointer)0x0;
    local_c8._8_8_ = (pointer)0x0;
    local_b8.spellings._M_t._M_impl._0_8_ = (pointer)0x0;
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::reserve
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_c8,
               local_78._M_impl.super__Rb_tree_header._M_node_count);
    reporter = local_d8;
    for (p_Var5 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &local_78._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::emplace_back<Catch::TagInfo>
                ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_c8,
                 (TagInfo *)&p_Var5[1]._M_left);
    }
    (*reporter->_vptr_IStreamingReporter[0x16])(reporter,local_c8,config);
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::~vector
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_c8);
    std::
    _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
    ::~_Rb_tree(&local_78);
    std::_Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::~_Vector_base
              (&local_48);
    cVar10 = '\x01';
  }
  if ((config->m_data).listReporters == true) {
    local_118 = (undefined1  [8])0x0;
    _Stack_110._0_8_ = (pointer)0x0;
    _Stack_110._M_parent = (_Base_ptr)0x0;
    pSVar6 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar2 = (*(pSVar6->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar6);
    lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x18))
                      ((long *)CONCAT44(extraout_var_01,iVar2));
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::reserve
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_118,*(size_type *)(lVar7 + 0x28));
    for (p_Var9 = *(_Rb_tree_node_base **)(lVar7 + 0x18);
        p_Var9 != (_Rb_tree_node_base *)(lVar7 + 8);
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      std::__cxx11::string::string((string *)local_c8,(string *)(p_Var9 + 1));
      pIVar8 = Detail::unique_ptr<Catch::IReporterFactory>::operator->
                         ((unique_ptr<Catch::IReporterFactory> *)(p_Var9 + 2));
      (*pIVar8->_vptr_IReporterFactory[3])
                (&local_b8.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,pIVar8);
      std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
      emplace_back<Catch::ReporterDescription>
                ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
                 local_118,(ReporterDescription *)local_c8);
      ReporterDescription::~ReporterDescription((ReporterDescription *)local_c8);
    }
    (*reporter->_vptr_IStreamingReporter[0x14])(reporter,local_118,config);
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::~vector
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_118);
    cVar10 = '\x01';
  }
  return (bool)cVar10;
}

Assistant:

bool list(IStreamingReporter &reporter, Config const &config) {
        bool listed = false;
        if (config.listTests()) {
            listed = true;
            listTests(reporter, config);
        }
        if (config.listTags()) {
            listed = true;
            listTags(reporter, config);
        }
        if (config.listReporters()) {
            listed = true;
            listReporters(reporter, config);
        }
        return listed;
    }